

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Cluster::GetLastTime(Cluster *this)

{
  longlong lVar1;
  Cluster *in_RDI;
  Block *pBlock;
  long status;
  BlockEntry *pEntry;
  long *in_stack_ffffffffffffffe8;
  Cluster *in_stack_fffffffffffffff8;
  
  lVar1 = GetLast(in_stack_fffffffffffffff8,(BlockEntry **)in_RDI);
  if (-1 < lVar1) {
    if (in_stack_ffffffffffffffe8 == (long *)0x0) {
      lVar1 = GetTime((Cluster *)0x0);
    }
    else {
      (**(code **)(*in_stack_ffffffffffffffe8 + 0x10))();
      lVar1 = Block::GetTime((Block *)in_stack_fffffffffffffff8,in_RDI);
    }
  }
  return lVar1;
}

Assistant:

long long Cluster::GetLastTime() const {
  const BlockEntry* pEntry;

  const long status = GetLast(pEntry);

  if (status < 0)  // error
    return status;

  if (pEntry == NULL)  // empty cluster
    return GetTime();

  const Block* const pBlock = pEntry->GetBlock();
  assert(pBlock);

  return pBlock->GetTime(this);
}